

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SmallVector<diligent_spirv_cross::Instruction,_8UL> * __thiscall
diligent_spirv_cross::SmallVector<diligent_spirv_cross::Instruction,_8UL>::operator=
          (SmallVector<diligent_spirv_cross::Instruction,_8UL> *this,
          SmallVector<diligent_spirv_cross::Instruction,_8UL> *other)

{
  Instruction *pIVar1;
  Instruction *pIVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (this != other) {
    (this->super_VectorView<diligent_spirv_cross::Instruction>).buffer_size = 0;
    reserve(this,(other->super_VectorView<diligent_spirv_cross::Instruction>).buffer_size);
    if ((other->super_VectorView<diligent_spirv_cross::Instruction>).buffer_size == 0) {
      uVar5 = 0;
    }
    else {
      lVar3 = 0;
      uVar4 = 0;
      do {
        pIVar1 = (this->super_VectorView<diligent_spirv_cross::Instruction>).ptr;
        pIVar2 = (other->super_VectorView<diligent_spirv_cross::Instruction>).ptr;
        *(undefined4 *)((long)&pIVar1->length + lVar3) =
             *(undefined4 *)((long)&pIVar2->length + lVar3);
        *(undefined8 *)((long)&pIVar1->op + lVar3) = *(undefined8 *)((long)&pIVar2->op + lVar3);
        uVar4 = uVar4 + 1;
        uVar5 = (other->super_VectorView<diligent_spirv_cross::Instruction>).buffer_size;
        lVar3 = lVar3 + 0xc;
      } while (uVar4 < uVar5);
    }
    (this->super_VectorView<diligent_spirv_cross::Instruction>).buffer_size = uVar5;
  }
  return this;
}

Assistant:

SmallVector &operator=(const SmallVector &other) SPIRV_CROSS_NOEXCEPT
	{
		if (this == &other)
			return *this;

		clear();
		reserve(other.buffer_size);
		for (size_t i = 0; i < other.buffer_size; i++)
			new (&this->ptr[i]) T(other.ptr[i]);
		this->buffer_size = other.buffer_size;
		return *this;
	}